

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::DefaultPrintTo<Struct>(void *param_1,ostream *param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  ostream *os_local;
  Struct *p_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (param_1 == (void *)0x0) {
    std::operator<<(param_2,"NULL");
  }
  else {
    std::ostream::operator<<(param_2,param_1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintPointer> /* dummy */,
                    T* p, ::std::ostream* os) {
  if (p == NULL) {
    *os << "NULL";
  } else {
    // T is not a function type.  We just call << to print p,
    // relying on ADL to pick up user-defined << for their pointer
    // types, if any.
    *os << p;
  }
}